

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::Transpose(ON_NurbsSurface *this)

{
  int iVar1;
  double *pdVar2;
  double *k;
  int i;
  ON_NurbsSurface *this_local;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  iVar1 = this->m_order[0];
  this->m_order[0] = this->m_order[1];
  this->m_order[1] = iVar1;
  iVar1 = this->m_cv_count[0];
  this->m_cv_count[0] = this->m_cv_count[1];
  this->m_cv_count[1] = iVar1;
  iVar1 = this->m_cv_stride[0];
  this->m_cv_stride[0] = this->m_cv_stride[1];
  this->m_cv_stride[1] = iVar1;
  iVar1 = this->m_knot_capacity[0];
  this->m_knot_capacity[0] = this->m_knot_capacity[1];
  this->m_knot_capacity[1] = iVar1;
  pdVar2 = this->m_knot[0];
  this->m_knot[0] = this->m_knot[1];
  this->m_knot[1] = pdVar2;
  return true;
}

Assistant:

bool
ON_NurbsSurface::Transpose()
{
  DestroySurfaceTree();
  int i;
  // transpose CV grid
  i = m_order[0]; m_order[0] = m_order[1]; m_order[1] = i;
  i = m_cv_count[0]; m_cv_count[0] = m_cv_count[1]; m_cv_count[1] = i;
  i = m_cv_stride[0]; m_cv_stride[0] = m_cv_stride[1]; m_cv_stride[1] = i;

  // swap knot vectors
  i = m_knot_capacity[0]; m_knot_capacity[0] = m_knot_capacity[1]; m_knot_capacity[1] = i;
  double* k = m_knot[0]; m_knot[0] = m_knot[1]; m_knot[1] = k;
  return true;
}